

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Embargo * __thiscall
capnp::_::anon_unknown_0::
ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo>::next
          (ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo>
           *this,uint *id)

{
  bool bVar1;
  size_t sVar2;
  const_reference pvVar3;
  uint *id_local;
  ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo>
  *this_local;
  
  bVar1 = std::
          priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
          ::empty(&this->freeIds);
  if (bVar1) {
    sVar2 = kj::Vector<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo>::size
                      (&this->slots);
    *id = (uint)sVar2;
    this_local = (ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo>
                  *)kj::Vector<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo>::add<>
                              (&this->slots);
  }
  else {
    pvVar3 = std::
             priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
             ::top(&this->freeIds);
    *id = *pvVar3;
    std::
    priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
    ::pop(&this->freeIds);
    this_local = (ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo>
                  *)kj::Vector<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo>::
                    operator[](&this->slots,(ulong)*id);
  }
  return (Embargo *)this_local;
}

Assistant:

T& next(Id& id) {
    if (freeIds.empty()) {
      id = slots.size();
      return slots.add();
    } else {
      id = freeIds.top();
      freeIds.pop();
      return slots[id];
    }
  }